

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.cpp
# Opt level: O2

int __thiscall FIX::Dictionary::getInt(Dictionary *this,string *key)

{
  signed_int sVar1;
  string asStack_a8 [4];
  
  getString(asStack_a8,this,key,false);
  sVar1 = IntConvertor::convert(asStack_a8);
  std::__cxx11::string::~string((string *)asStack_a8);
  return sVar1;
}

Assistant:

int Dictionary::getInt( const std::string& key ) const
EXCEPT ( ConfigError, FieldConvertError )
{
  try
  {
    return IntConvertor::convert( getString(key) );
  }
  catch ( FieldConvertError& )
  {
    throw ConfigError( "Illegal value " + getString(key) + " for " + key );
  }
}